

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_publisher_link.cpp
# Opt level: O2

void __thiscall miniros::TransportPublisherLink::drop(TransportPublisherLink *this)

{
  PublisherLinkPtr local_30;
  SubscriptionPtr parent;
  
  this->dropping_ = true;
  Connection::drop((this->connection_).
                   super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   Destructing);
  std::__shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&parent.super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>,
             &(this->super_PublisherLink).parent_);
  if (parent.super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<miniros::PublisherLink,void>
              ((__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2> *)&local_30,
               (__weak_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_PublisherLink).super_enable_shared_from_this<miniros::PublisherLink>);
    Subscription::removePublisherLink
              (parent.super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_30.super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parent.super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void TransportPublisherLink::drop()
{
  dropping_ = true;
  connection_->drop(Connection::Destructing);

  if (SubscriptionPtr parent = parent_.lock())
  {
    parent->removePublisherLink(shared_from_this());
  }
}